

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O0

void stbtt__csctx_rccurve_to
               (stbtt__csctx *ctx,float dx1,float dy1,float dx2,float dy2,float dx3,float dy3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float cy2;
  float cx2;
  float cy1;
  float cx1;
  float dy3_local;
  float dx3_local;
  float dy2_local;
  float dx2_local;
  float dy1_local;
  float dx1_local;
  stbtt__csctx *ctx_local;
  
  fVar1 = ctx->x + dx1;
  fVar2 = ctx->y + dy1;
  fVar3 = fVar1 + dx2;
  fVar4 = fVar2 + dy2;
  ctx->x = fVar3 + dx3;
  ctx->y = fVar4 + dy3;
  stbtt__csctx_v(ctx,'\x04',(int)ctx->x,(int)ctx->y,(int)fVar1,(int)fVar2,(int)fVar3,(int)fVar4);
  return;
}

Assistant:

static void stbtt__csctx_rccurve_to(stbtt__csctx *ctx, float dx1, float dy1, float dx2, float dy2, float dx3, float dy3)
{
   float cx1 = ctx->x + dx1;
   float cy1 = ctx->y + dy1;
   float cx2 = cx1 + dx2;
   float cy2 = cy1 + dy2;
   ctx->x = cx2 + dx3;
   ctx->y = cy2 + dy3;
   stbtt__csctx_v(ctx, STBTT_vcubic, (int)ctx->x, (int)ctx->y, (int)cx1, (int)cy1, (int)cx2, (int)cy2);
}